

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O2

ngram_model_t * ngram_model_trie_read_dmp(ps_config_t *config,char *file_name,logmath_t *lmath)

{
  int32 iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  ngram_model_t *base;
  lm_trie_t *plVar4;
  ngram_raw_t **raw_ngrams;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint32 unigram_count;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  float fVar12;
  uint local_498;
  int32 k;
  uint local_490;
  float local_48c;
  uint local_488;
  uint local_484;
  float local_480;
  float local_47c;
  uint local_478;
  int32 is_pipe;
  uint32 *local_470;
  int local_468;
  uint local_464;
  int32 vn;
  uint32 counts [3];
  int32 mapid;
  int32 ts;
  char str [1024];
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,0x1cf,"Trying to read LM in dmp format\n");
  __stream = (FILE *)fopen_comp(file_name,"rb",&is_pipe);
  if (__stream == (FILE *)0x0) {
    pcVar6 = "Dump file %s not found\n";
    lVar7 = 0x1d1;
  }
  else {
    sVar3 = fread(&k,4,1,__stream);
    iVar1 = k;
    if (k == 0x11) {
      uVar5 = 0x11;
      local_484 = 0;
    }
    else {
      uVar5 = (uint)k >> 0x18 | (k & 0xff0000U) >> 8 | (k & 0xff00U) << 8 | k << 0x18;
      if (k != 0x11000000) {
        k = uVar5;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                ,0x1dc,"Wrong magic header size number %x: %s is not a dump file\n",(ulong)uVar5,
                file_name);
        return (ngram_model_t *)0x0;
      }
      local_484 = (uint)CONCAT71((int7)(sVar3 >> 8),1);
      k = uVar5;
    }
    sVar10 = (size_t)(int)uVar5;
    sVar3 = fread(str,1,sVar10,__stream);
    if (sVar3 != sVar10) {
      pcVar6 = "Cannot read header\n";
      lVar7 = 0x1e2;
LAB_0010f077:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
              ,lVar7,pcVar6);
      return (ngram_model_t *)0x0;
    }
    iVar2 = strncmp(str,"Darpa Trigram LM",sVar10);
    if (iVar2 == 0) {
      sVar3 = fread(&k,4,1,__stream);
      if (sVar3 == 1) {
        if (iVar1 != 0x11) {
          k = (uint)k >> 0x18 | (k & 0xff0000U) >> 8 | (k & 0xff00U) << 8 | k << 0x18;
        }
        sVar10 = (size_t)k;
        sVar3 = fread(str,1,sVar10,__stream);
        if (sVar3 != sVar10) {
          pcVar6 = "Cannot read LM filename in header\n";
          lVar7 = 0x1ef;
          goto LAB_0010f077;
        }
        sVar3 = fread(&vn,4,1,__stream);
        if (sVar3 == 1) {
          uVar5 = (uint)vn >> 0x18 | (vn & 0xff0000U) >> 8 | (vn & 0xff00U) << 8 | vn << 0x18;
          if (iVar1 == 0x11) {
            uVar5 = vn;
          }
          uVar8 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            sVar3 = fread(&ts,4,1,__stream);
            if (sVar3 == 1) {
              do {
                sVar3 = fread(&k,4,1,__stream);
                if (sVar3 != 1) {
                  return (ngram_model_t *)0x0;
                }
                if (iVar1 != 0x11) {
                  k = (uint)k >> 0x18 | (k & 0xff0000U) >> 8 | (k & 0xff00U) << 8 | k << 0x18;
                }
                if (k == 0) {
                  sVar3 = fread(&local_498,4,1,__stream);
                  if (sVar3 != 1) {
                    return (ngram_model_t *)0x0;
                  }
                  uVar8 = (ulong)local_498;
                  if (iVar1 != 0x11) {
                    local_498 = local_498 >> 0x18 | (local_498 & 0xff0000) >> 8 |
                                (local_498 & 0xff00) << 8 | local_498 << 0x18;
                    uVar8 = (ulong)local_498;
                  }
                  goto LAB_0010f12f;
                }
                sVar10 = (size_t)k;
                sVar3 = fread(str,1,sVar10,__stream);
              } while (sVar3 == sVar10);
              pcVar6 = "Failed to read word\n";
              lVar7 = 0x208;
              goto LAB_0010f077;
            }
          }
          else {
LAB_0010f12f:
            unigram_count = (uint32)uVar8;
            counts[0] = unigram_count;
            sVar3 = fread(&local_498,4,1,__stream);
            if (sVar3 == 1) {
              if (iVar1 != 0x11) {
                local_498 = local_498 >> 0x18 | (local_498 & 0xff0000) >> 8 |
                            (local_498 & 0xff00) << 8 | local_498 << 0x18;
              }
              uVar5 = local_498;
              uVar11 = (ulong)local_498;
              counts[1] = local_498;
              sVar3 = fread(&local_498,4,1,__stream);
              if (sVar3 == 1) {
                local_490 = local_498 >> 0x18 | (local_498 & 0xff0000) >> 8 |
                            (local_498 & 0xff00) << 8 | local_498 << 0x18;
                if (iVar1 == 0x11) {
                  local_490 = local_498;
                }
                counts[2] = local_490;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                        ,0x221,"ngrams 1=%d, 2=%d, 3=%d\n",uVar8,uVar11,local_490);
                base = (ngram_model_t *)
                       __ckd_calloc__(1,0x68,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                      ,0x223);
                local_468 = 3;
                if (local_490 == 0) {
                  local_468 = 2 - (uint)(uVar5 == 0);
                }
                local_464 = uVar5;
                ngram_model_init(base,&ngram_model_trie_funcs,lmath,local_468,unigram_count);
                plVar4 = lm_trie_create(unigram_count,local_468);
                *(lm_trie_t **)(base + 1) = plVar4;
                local_470 = (uint32 *)
                            __ckd_calloc__((long)(int)(unigram_count + 1),8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                           ,0x231);
                for (uVar5 = 0; iVar2 = local_468, uVar5 <= unigram_count; uVar5 = uVar5 + 1) {
                  fread(&mapid,4,1,__stream);
                  fread(&local_47c,4,1,__stream);
                  fread(&local_480,4,1,__stream);
                  fread(&local_478,4,1,__stream);
                  if (iVar1 == 0x11) {
                    local_48c = local_480;
                    local_488 = local_478;
                    fVar12 = local_47c;
                  }
                  else {
                    fVar12 = (float)((uint)local_47c >> 0x18 | ((uint)local_47c & 0xff0000) >> 8 |
                                     ((uint)local_47c & 0xff00) << 8 | (int)local_47c << 0x18);
                    local_48c = (float)((uint)local_480 >> 0x18 | ((uint)local_480 & 0xff0000) >> 8
                                        | ((uint)local_480 & 0xff00) << 8 | (int)local_480 << 0x18);
                    local_488 = local_478 >> 0x18 | (local_478 & 0xff0000) >> 8 |
                                (local_478 & 0xff00) << 8 | local_478 << 0x18;
                  }
                  fVar12 = logmath_log10_to_log_float(lmath,(float64)(double)fVar12);
                  lVar9 = (ulong)uVar5 * 0xc;
                  *(float *)(*(long *)(*(long *)(base + 1) + 0x10) + lVar9) = fVar12;
                  fVar12 = logmath_log10_to_log_float(lmath,(float64)(double)local_48c);
                  lVar7 = *(long *)(*(long *)(base + 1) + 0x10);
                  *(float *)(lVar7 + 4 + lVar9) = fVar12;
                  *(uint *)(lVar7 + 8 + lVar9) = local_488;
                  local_470[uVar5] = local_488;
                }
                uVar5 = local_484 & 0xff;
                if (local_490 != 0 || local_464 != 0) {
                  raw_ngrams = ngrams_raw_read_dmp((FILE *)__stream,lmath,counts,local_468,local_470
                                                   ,(uint8)local_484);
                  if (raw_ngrams == (ngram_raw_t **)0x0) {
                    ngram_model_free(base);
                    ckd_free(local_470);
                    fclose_comp((FILE *)__stream,is_pipe);
                    return (ngram_model_t *)0x0;
                  }
                  lm_trie_build(*(lm_trie_t **)(base + 1),raw_ngrams,counts,base->n_counts,iVar2);
                  ngrams_raw_free(raw_ngrams,counts,iVar2);
                }
                ckd_free(local_470);
                read_word_str(base,(FILE *)__stream,uVar5);
                fclose_comp((FILE *)__stream,is_pipe);
                return base;
              }
            }
          }
        }
      }
      return (ngram_model_t *)0x0;
    }
    pcVar6 = "Wrong header %s: %s is not a dump file\n";
    file_name = "Darpa Trigram LM";
    lVar7 = 0x1e6;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,lVar7,pcVar6,file_name);
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_trie_read_dmp(ps_config_t * config,
                          const char *file_name, logmath_t * lmath)
{
    uint8 do_swap;
    int32 is_pipe;
    int32 k;
    uint32 j;
    int32 vn, ts;
    int32 count;
    uint32 counts[3];
    uint32 *unigram_next;
    int order;
    char str[1024];
    FILE *fp;
    ngram_model_trie_t *model;
    ngram_model_t *base;
    ngram_raw_t **raw_ngrams;

    (void)config;
    E_INFO("Trying to read LM in dmp format\n");
    if ((fp = fopen_comp(file_name, "rb", &is_pipe)) == NULL) {
        E_ERROR("Dump file %s not found\n", file_name);
        return NULL;
    }

    do_swap = FALSE;
    fread(&k, sizeof(k), 1, fp);
    if (k != strlen(dmp_hdr) + 1) {
        SWAP_INT32(&k);
        if (k != strlen(dmp_hdr) + 1) {
            E_ERROR
                ("Wrong magic header size number %x: %s is not a dump file\n",
                 k, file_name);
            return NULL;
        }
        do_swap = 1;
    }
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read header\n");
        return NULL;
    }
    if (strncmp(str, dmp_hdr, k) != 0) {
        E_ERROR("Wrong header %s: %s is not a dump file\n", dmp_hdr);
        return NULL;
    }

    if (fread(&k, sizeof(k), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&k);
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read LM filename in header\n");
        return NULL;
    }

    /* read version#, if present (must be <= 0) */
    if (fread(&vn, sizeof(vn), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&vn);
    if (vn <= 0) {
        /* read and don't compare timestamps (we don't care) */
        if (fread(&ts, sizeof(ts), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&ts);

        /* read and skip format description */
        for (;;) {
            if (fread(&k, sizeof(k), 1, fp) != 1)
                return NULL;
            if (do_swap)
                SWAP_INT32(&k);
            if (k == 0)
                break;
            if (fread(str, 1, k, fp) != (size_t) k) {
                E_ERROR("Failed to read word\n");
                return NULL;
            }
        }
        /* read model->ucount */
        if (fread(&count, sizeof(count), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&count);
        counts[0] = count;
    }
    else {
        counts[0] = vn;
    }
    /* read model->bcount, tcount */
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[1] = count;
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[2] = count;
    E_INFO("ngrams 1=%d, 2=%d, 3=%d\n", counts[0], counts[1], counts[2]);

    model = (ngram_model_trie_t *) ckd_calloc(1, sizeof(*model));
    base = &model->base;
    if (counts[2] > 0)
        order = 3;
    else if (counts[1] > 0)
        order = 2;
    else
        order = 1;
    ngram_model_init(base, &ngram_model_trie_funcs, lmath, order,
                     (int32) counts[0]);

    model->trie = lm_trie_create(counts[0], order);

    unigram_next =
        (uint32 *) ckd_calloc((int32) counts[0] + 1, sizeof(unigram_next));
    for (j = 0; j <= counts[0]; j++) {
        int32 bigrams;
        int32 mapid;
        dmp_weight_t weightp;
        dmp_weight_t weightb;

        /* Skip over the mapping ID, we don't care about it. */
        /* Read the weights from actual unigram structure. */
        fread(&mapid, sizeof(int32), 1, fp);
        fread(&weightp, sizeof(weightp), 1, fp);
        fread(&weightb, sizeof(weightb), 1, fp);
        fread(&bigrams, sizeof(int32), 1, fp);
        if (do_swap) {
            SWAP_INT32(&weightp.l);
            SWAP_INT32(&weightb.l);
            SWAP_INT32(&bigrams);
        }
        model->trie->unigrams[j].prob = logmath_log10_to_log_float(lmath, weightp.f);
        model->trie->unigrams[j].bo = logmath_log10_to_log_float(lmath, weightb.f);
        model->trie->unigrams[j].next = bigrams;
        unigram_next[j] = bigrams;
    }

    if (order > 1) {
        raw_ngrams =
            ngrams_raw_read_dmp(fp, lmath, counts, order, unigram_next,
                                do_swap);
        if (raw_ngrams == NULL) {
            ngram_model_free(base);
            ckd_free(unigram_next);
            fclose_comp(fp, is_pipe);
            return NULL;
        }
        lm_trie_build(model->trie, raw_ngrams, counts, base->n_counts, order);        
        ngrams_raw_free(raw_ngrams, counts, order);
    }
    
    /* Sentinel unigram and bigrams read before */
    ckd_free(unigram_next);

    /* read ascii word strings */
    read_word_str(base, fp, do_swap);

    fclose_comp(fp, is_pipe);
    return base;
}